

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
::reserve(vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
          *this,size_t n)

{
  BilinearPatchMesh **ppBVar1;
  iterator ppBVar2;
  ulong in_RSI;
  vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
  *in_RDI;
  int i;
  BilinearPatchMesh **ra;
  BilinearPatchMesh **in_stack_ffffffffffffffc8;
  polymorphic_allocator<const_pbrt::BilinearPatchMesh_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    ppBVar1 = pmr::polymorphic_allocator<pbrt::BilinearPatchMesh_const*>::
              allocate_object<pbrt::BilinearPatchMesh_const*>
                        (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 =
           (polymorphic_allocator<const_pbrt::BilinearPatchMesh_*> *)(ppBVar1 + local_1c);
      ppBVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::BilinearPatchMesh_const*>::
      construct<pbrt::BilinearPatchMesh_const*,pbrt::BilinearPatchMesh_const*>
                ((polymorphic_allocator<pbrt::BilinearPatchMesh_const*> *)in_RDI,
                 (BilinearPatchMesh **)in_stack_ffffffffffffffd0,ppBVar2 + local_1c);
      ppBVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::BilinearPatchMesh_const*>::
      destroy<pbrt::BilinearPatchMesh_const*>
                ((polymorphic_allocator<pbrt::BilinearPatchMesh_const*> *)in_RDI,ppBVar2 + local_1c)
      ;
    }
    pmr::polymorphic_allocator<pbrt::BilinearPatchMesh_const*>::
    deallocate_object<pbrt::BilinearPatchMesh_const*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x492dc4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = ppBVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }